

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateDependentAccessorDeclarations
          (MessageFieldGenerator *this,Printer *printer)

{
  if (this->dependent_field_ == true) {
    io::Printer::Print(printer,&this->variables_,
                       "$deprecated_attr$$type$* mutable_$name$();\n$deprecated_attr$$type$* $release_name$();\n$deprecated_attr$void set_allocated_$name$($type$* $name$);\n"
                      );
    return;
  }
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateDependentAccessorDeclarations(io::Printer* printer) const {
  if (!dependent_field_) {
    return;
  }
  // Arena manipulation code is out-of-line in the derived message class.
  printer->Print(variables_,
    "$deprecated_attr$$type$* mutable_$name$();\n"
    "$deprecated_attr$$type$* $release_name$();\n"
    "$deprecated_attr$void set_allocated_$name$($type$* $name$);\n");
}